

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O1

Status __thiscall
soplex::SoPlexBase<double>::_solveRealForRational
          (SoPlexBase<double> *this,bool fromscratch,VectorBase<double> *primal,
          VectorBase<double> *dual,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusRows,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *basisStatusCols)

{
  SPxSolverBase<double> *pSVar1;
  double dVar2;
  int iVar3;
  Verbosity VVar4;
  SPxStatus SVar5;
  SPxScaler<double> *pSVar6;
  ostream *poVar7;
  char cVar8;
  SPxLPRational *pSVar9;
  char cVar10;
  uint uVar11;
  Status SVar12;
  int iVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Verbosity old_verbosity_2;
  undefined7 in_register_00000031;
  EVP_PKEY_CTX *old;
  Verbosity old_verbosity;
  double extraout_XMM0_Qa;
  SPxLPRational *rationalLP;
  VectorBase<double> tmpRedCost;
  VectorBase<double> tmpDual;
  VectorBase<double> tmpSlacks;
  VectorBase<double> tmpPrimal;
  SPxLPBase<double> local_1f8;
  
  old = (EVP_PKEY_CTX *)CONCAT71(in_register_00000031,fromscratch);
  if (((int)old == 0) && (this->_hasBasis != false)) {
    this->_simplifier = (SPxSimplifier<double> *)0x0;
    if (this->_isRealLPScaled == false) {
      this->_scaler = (SPxScaler<double> *)0x0;
    }
  }
  else {
    _enableSimplifierAndScaler(this);
  }
  if (fromscratch) {
    SPxSolverBase<double>::reLoad(&this->_solver);
  }
  (*this->_statistics->syncTime->_vptr_Timer[3])();
  rationalLP = (SPxLPRational *)0x0;
  if (this->_scaler != (SPxScaler<double> *)0x0 || this->_simplifier != (SPxSimplifier<double> *)0x0
     ) {
    spx_alloc<soplex::SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>*>
              (&rationalLP,1);
    pSVar9 = rationalLP;
    old = (EVP_PKEY_CTX *)&this->_solver;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::SPxLPBase<double>(rationalLP,(SPxLPBase<double> *)old);
    rationalLP = pSVar9;
  }
  if (((this->_scaler != (SPxScaler<double> *)0x0 ||
       this->_simplifier != (SPxSimplifier<double> *)0x0) || fromscratch) &&
     ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED)) {
    SLUFactorRational::init(&this->_rationalLUSolver,old);
  }
  (*this->_statistics->syncTime->_vptr_Timer[4])();
  iVar3 = this->_statistics->iterations;
  if (this->_simplifier == (SPxSimplifier<double> *)0x0) {
    uVar11 = 0;
  }
  else {
    iVar13 = this->_currentSettings->_intParamValues[0xe];
    dVar2 = (this->_solver).maxTime;
    (*((this->_solver).theTime)->_vptr_Timer[6])();
    old = (EVP_PKEY_CTX *)&this->_solver;
    uVar11 = (*this->_simplifier->_vptr_SPxSimplifier[5])
                       (dVar2 - extraout_XMM0_Qa,this->_simplifier,old,(ulong)(iVar13 == 3),
                        (ulong)(this->_solver).random.seedshift);
  }
  pSVar6 = this->_scaler;
  if (uVar11 == 0 && pSVar6 != (SPxScaler<double> *)0x0) {
    old = (EVP_PKEY_CTX *)&this->_solver;
    (*pSVar6->_vptr_SPxScaler[0xd])(pSVar6,old,0);
  }
  if (uVar11 == 0) {
    VVar4 = (this->spxout).m_verbosity;
    if (2 < (int)VVar4) {
      (this->spxout).m_verbosity = INFO1;
      poVar7 = (this->spxout).m_streams[3];
      cVar8 = (char)poVar7;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar8);
      std::ostream::put(cVar8);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar4;
    }
    old = (EVP_PKEY_CTX *)0x0;
    _solveRealLPAndRecordStatistics(this,(bool *)0x0);
    VVar4 = (this->spxout).m_verbosity;
    if (2 < (int)VVar4) {
      (this->spxout).m_verbosity = INFO1;
      poVar7 = (this->spxout).m_streams[3];
      cVar8 = (char)poVar7;
      cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + cVar8);
      old = (EVP_PKEY_CTX *)(ulong)(uint)(int)cVar10;
      std::ostream::put(cVar8);
      std::ostream::flush();
      (this->spxout).m_verbosity = VVar4;
    }
  }
  if (uVar11 - 1 < 3) {
    SVar12 = *(Status *)(&DAT_00612f38 + (ulong)(uVar11 - 1) * 4);
  }
  else if ((uVar11 & 0xfffffffb) == 0) {
    SVar12 = OPTIMAL;
    if (uVar11 != 4) {
      SVar12 = SPxSolverBase<double>::status(&this->_solver);
    }
    switch(SVar12) {
    case OPTIMAL:
      if (this->_simplifier == (SPxSimplifier<double> *)0x0) {
        pSVar1 = &this->_solver;
        SPxSolverBase<double>::getPrimalSol(pSVar1,primal);
        SPxSolverBase<double>::getDualSol(pSVar1,dual);
        pSVar6 = this->_scaler;
        if (pSVar6 != (SPxScaler<double> *)0x0) {
          (*pSVar6->_vptr_SPxScaler[0x22])(pSVar6,pSVar1,primal);
          (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,pSVar1,dual);
        }
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusRows,
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusCols,
                   (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        SPxSolverBase<double>::getBasis
                  (pSVar1,basisStatusRows->data,basisStatusCols->data,basisStatusRows->thesize,
                   basisStatusCols->thesize);
        this->_hasBasis = true;
      }
      else {
        iVar13 = 0;
        if (uVar11 != 4) {
          iVar13 = (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
        }
        VectorBase<double>::VectorBase(&tmpPrimal,iVar13);
        iVar13 = 0;
        if (uVar11 != 4) {
          iVar13 = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
        }
        VectorBase<double>::VectorBase(&tmpSlacks,iVar13);
        iVar13 = 0;
        if (uVar11 != 4) {
          iVar13 = (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
        }
        VectorBase<double>::VectorBase(&tmpDual,iVar13);
        iVar13 = 0;
        if (uVar11 != 4) {
          iVar13 = (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
        }
        VectorBase<double>::VectorBase(&tmpRedCost,iVar13);
        if (uVar11 != 4) {
          pSVar1 = &this->_solver;
          SPxSolverBase<double>::getPrimalSol(pSVar1,&tmpPrimal);
          SPxSolverBase<double>::getSlacks(pSVar1,&tmpSlacks);
          SPxSolverBase<double>::getDualSol(pSVar1,&tmpDual);
          SPxSolverBase<double>::getRedCostSol(pSVar1,&tmpRedCost);
          pSVar6 = this->_scaler;
          if (pSVar6 != (SPxScaler<double> *)0x0) {
            (*pSVar6->_vptr_SPxScaler[0x22])(pSVar6,pSVar1,&tmpPrimal);
            (*this->_scaler->_vptr_SPxScaler[0x23])(this->_scaler,pSVar1,&tmpSlacks);
            (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,pSVar1,&tmpDual);
            (*this->_scaler->_vptr_SPxScaler[0x25])(this->_scaler,pSVar1,&tmpRedCost);
          }
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                    (basisStatusRows,
                     (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
          DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                    (basisStatusCols,
                     (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                     super_SVSetBase<double>.set.thenum);
          SPxSolverBase<double>::getBasis
                    (pSVar1,basisStatusRows->data,basisStatusCols->data,basisStatusRows->thesize,
                     basisStatusCols->thesize);
        }
        (*this->_simplifier->_vptr_SPxSimplifier[6])
                  (this->_simplifier,&tmpPrimal,&tmpDual,&tmpSlacks,&tmpRedCost,
                   basisStatusRows->data,basisStatusCols->data,1);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusRows,
                   (this->_rationalLP->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thenum);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusCols,
                   (this->_rationalLP->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   .set.thenum);
        (*this->_simplifier->_vptr_SPxSimplifier[0xf])
                  (this->_simplifier,basisStatusRows->data,basisStatusCols->data,
                   (ulong)(uint)basisStatusRows->thesize,(ulong)(uint)basisStatusCols->thesize);
        this->_hasBasis = true;
        iVar13 = (*this->_simplifier->_vptr_SPxSimplifier[9])();
        VectorBase<double>::operator=(primal,(VectorBase<double> *)CONCAT44(extraout_var,iVar13));
        iVar13 = (*this->_simplifier->_vptr_SPxSimplifier[10])();
        VectorBase<double>::operator=(dual,(VectorBase<double> *)CONCAT44(extraout_var_00,iVar13));
        if (tmpRedCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(tmpRedCost.val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start,
                          (long)tmpRedCost.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)tmpRedCost.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (tmpDual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(tmpDual.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)tmpDual.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)tmpDual.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (tmpSlacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(tmpSlacks.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)tmpSlacks.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)tmpSlacks.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (tmpPrimal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(tmpPrimal.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)tmpPrimal.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)tmpPrimal.val.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (((iVar3 < this->_statistics->iterations) ||
          ((this->_oldBasisStatusRows).thesize != basisStatusRows->thesize)) ||
         (SVar12 = OPTIMAL, (this->_oldBasisStatusCols).thesize != basisStatusCols->thesize)) {
        SVar12 = OPTIMAL;
        _storeBasisAsOldBasis(this,basisStatusRows,basisStatusCols);
      }
      break;
    case INFEASIBLE:
      if (this->_simplifier == (SPxSimplifier<double> *)0x0) {
        pSVar1 = &this->_solver;
        SPxSolverBase<double>::getDualfarkas(pSVar1,dual);
        pSVar6 = this->_scaler;
        if (pSVar6 != (SPxScaler<double> *)0x0) {
          (*pSVar6->_vptr_SPxScaler[0x24])(pSVar6,pSVar1,dual);
        }
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusRows,
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusCols,
                   (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        SPxSolverBase<double>::getBasis
                  (pSVar1,basisStatusRows->data,basisStatusCols->data,basisStatusRows->thesize,
                   basisStatusCols->thesize);
        this->_hasBasis = true;
        if (((iVar3 < this->_statistics->iterations) ||
            ((this->_oldBasisStatusRows).thesize != basisStatusRows->thesize)) ||
           (SVar12 = INFEASIBLE, (this->_oldBasisStatusCols).thesize != basisStatusCols->thesize)) {
          SVar12 = INFEASIBLE;
          _storeBasisAsOldBasis(this,basisStatusRows,basisStatusCols);
        }
      }
      else {
        this->_hasBasis = false;
        SVar12 = INFEASIBLE;
        if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
          SLUFactorRational::init(&this->_rationalLUSolver,old);
        }
      }
      break;
    case ABORT_CYCLING:
      SVar12 = ABORT_CYCLING;
      if ((this->_simplifier == (SPxSimplifier<double> *)0x0) &&
         (this->_currentSettings->_boolParamValues[4] == true)) {
        pSVar1 = &this->_solver;
        SPxSolverBase<double>::getPrimalSol(pSVar1,primal);
        SPxSolverBase<double>::getDualSol(pSVar1,dual);
        pSVar6 = this->_scaler;
        if (pSVar6 != (SPxScaler<double> *)0x0) {
          (*pSVar6->_vptr_SPxScaler[0x22])(pSVar6,pSVar1,primal);
          (*this->_scaler->_vptr_SPxScaler[0x24])(this->_scaler,pSVar1,dual);
        }
      }
      break;
    case ABORT_TIME:
    case ABORT_ITER:
    case ABORT_VALUE:
    case REGULAR:
    case RUNNING:
    case UNBOUNDED:
      SVar5 = (this->_solver).super_SPxBasisBase<double>.thestatus;
      this->_hasBasis = NO_PROBLEM < SVar5;
      if ((NO_PROBLEM < SVar5) && (this->_simplifier == (SPxSimplifier<double> *)0x0)) {
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusRows,
                   (this->_solver).super_SPxLPBase<double>.super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
                  (basisStatusCols,
                   (this->_solver).super_SPxLPBase<double>.super_LPColSetBase<double>.
                   super_SVSetBase<double>.set.thenum);
        SPxSolverBase<double>::getBasis
                  (&this->_solver,basisStatusRows->data,basisStatusCols->data,
                   basisStatusRows->thesize,basisStatusCols->thesize);
        if ((iVar3 < this->_statistics->iterations) ||
           (((this->_oldBasisStatusRows).thesize != basisStatusRows->thesize ||
            ((this->_oldBasisStatusCols).thesize != basisStatusCols->thesize)))) {
          _storeBasisAsOldBasis(this,basisStatusRows,basisStatusCols);
        }
        break;
      }
    default:
      this->_hasBasis = false;
      if ((this->_rationalLUSolver).super_CLUFactorRational.stat != UNLOADED) {
        SLUFactorRational::init(&this->_rationalLUSolver,old);
      }
    }
  }
  else {
    SVar12 = UNKNOWN;
  }
  if (this->_scaler != (SPxScaler<double> *)0x0 || this->_simplifier != (SPxSimplifier<double> *)0x0
     ) {
    SPxLPBase<double>::
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
              (&local_1f8,rationalLP);
    SPxSolverBase<double>::loadLP(&this->_solver,&local_1f8,true);
    SPxLPBase<double>::~SPxLPBase(&local_1f8);
    (**(rationalLP->
       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       ).
       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       .
       super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
       ._vptr_ClassArray)();
    free(rationalLP);
    rationalLP = (SPxLPRational *)0x0;
    if (this->_hasBasis == true) {
      SPxSolverBase<double>::setBasis(&this->_solver,basisStatusRows->data,basisStatusCols->data);
    }
  }
  return SVar12;
}

Assistant:

typename SPxSolverBase<R>::Status SoPlexBase<R>::_solveRealForRational(bool fromscratch,
      VectorBase<R>& primal, VectorBase<R>& dual,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusRows,
      DataArray< typename SPxSolverBase<R>::VarStatus >& basisStatusCols)
{
   assert(_isConsistent());

   assert(_solver.nRows() == numRowsRational());
   assert(_solver.nCols() == numColsRational());
   assert(primal.dim() == numColsRational());
   assert(dual.dim() == numRowsRational());

   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

#ifndef SOPLEX_MANUAL_ALT

   if(fromscratch || !_hasBasis)
      _enableSimplifierAndScaler();
   else
      _disableSimplifierAndScaler();

#else
   _disableSimplifierAndScaler();
#endif

   // reset basis to slack basis when solving from scratch
   if(fromscratch)
      _solver.reLoad();

   // start timing
   _statistics->syncTime->start();

   // if preprocessing is applied, we need to restore the original LP at the end
   SPxLPRational* rationalLP = nullptr;

   if(_simplifier != nullptr || _scaler != nullptr)
   {
      spx_alloc(rationalLP);
      rationalLP = new(rationalLP) SPxLPRational(_solver);
   }

   // with preprocessing or solving from scratch, the basis may change, hence invalidate the
   // rational basis factorization
   if(_simplifier != nullptr || _scaler != nullptr || fromscratch)
      _rationalLUSolver.clear();

   // stop timing
   _statistics->syncTime->stop();

   try
   {
      // apply problem simplification
      typename SPxSimplifier<R>::Result simplificationStatus = SPxSimplifier<R>::OKAY;

      int oldIterations = _statistics->iterations; // save previous number of iterations

      if(_simplifier != nullptr)
      {
         // do not remove bounds of boxed variables or sides of ranged rows if bound flipping is used
         bool keepbounds = intParam(SoPlexBase<R>::RATIOTESTER) == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING;
         Real remainingTime = _solver.getMaxTime() - _solver.time();
         simplificationStatus = _simplifier->simplify(_solver, remainingTime, keepbounds,
                                _solver.random.getSeed());
      }

      // apply scaling after the simplification
      if(_scaler != nullptr && simplificationStatus == SPxSimplifier<R>::OKAY)
         _scaler->scale(_solver, false);

      // run the simplex method if problem has not been solved by the simplifier
      if(simplificationStatus == SPxSimplifier<R>::OKAY)
      {
         SPX_MSG_INFO1(spxout, spxout << std::endl);

         _solveRealLPAndRecordStatistics();

         SPX_MSG_INFO1(spxout, spxout << std::endl);
      }

      ///@todo move to private helper methods
      // evaluate status flag
      if(simplificationStatus == SPxSimplifier<R>::INFEASIBLE)
         result = SPxSolverBase<R>::INFEASIBLE;
      else if(simplificationStatus == SPxSimplifier<R>::DUAL_INFEASIBLE)
         result = SPxSolverBase<R>::INForUNBD;
      else if(simplificationStatus == SPxSimplifier<R>::UNBOUNDED)
         result = SPxSolverBase<R>::UNBOUNDED;
      else if(simplificationStatus == SPxSimplifier<R>::VANISHED
              || simplificationStatus == SPxSimplifier<R>::OKAY)
      {
         result = simplificationStatus == SPxSimplifier<R>::VANISHED ? SPxSolverBase<R>::OPTIMAL :
                  _solver.status();

         ///@todo move to private helper methods
         // process result
         switch(result)
         {
         case SPxSolverBase<R>::OPTIMAL:

            // unsimplify if simplifier is active and LP is solved to optimality; this must be done here and not at solution
            // query, because we want to have the basis for the original problem
            if(_simplifier != nullptr)
            {
               assert(!_simplifier->isUnsimplified());
               assert(simplificationStatus == SPxSimplifier<R>::VANISHED
                      || simplificationStatus == SPxSimplifier<R>::OKAY);

               bool vanished = simplificationStatus == SPxSimplifier<R>::VANISHED;

               // get solution vectors for transformed problem
               VectorBase<R> tmpPrimal(vanished ? 0 : _solver.nCols());
               VectorBase<R> tmpSlacks(vanished ? 0 : _solver.nRows());
               VectorBase<R> tmpDual(vanished ? 0 : _solver.nRows());
               VectorBase<R> tmpRedCost(vanished ? 0 : _solver.nCols());

               if(!vanished)
               {
                  assert(_solver.status() == SPxSolverBase<R>::OPTIMAL);

                  _solver.getPrimalSol(tmpPrimal);
                  _solver.getSlacks(tmpSlacks);
                  _solver.getDualSol(tmpDual);
                  _solver.getRedCostSol(tmpRedCost);

                  // unscale vectors
                  if(_scaler != nullptr)
                  {
                     _scaler->unscalePrimal(_solver, tmpPrimal);
                     _scaler->unscaleSlacks(_solver, tmpSlacks);
                     _scaler->unscaleDual(_solver, tmpDual);
                     _scaler->unscaleRedCost(_solver, tmpRedCost);
                  }

                  // get basis of transformed problem
                  basisStatusRows.reSize(_solver.nRows());
                  basisStatusCols.reSize(_solver.nCols());
                  _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                   basisStatusCols.size());
               }

               try
               {
                  _simplifier->unsimplify(tmpPrimal, tmpDual, tmpSlacks, tmpRedCost, basisStatusRows.get_ptr(),
                                          basisStatusCols.get_ptr());
               }
               catch(const SPxInternalCodeException& E)
               {
                  // error message has already been printed
                  throw SPxInternalCodeException("Error storing the basis");
               }

               // store basis for original problem
               basisStatusRows.reSize(numRowsRational());
               basisStatusCols.reSize(numColsRational());
               _simplifier->getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                     basisStatusCols.size());
               _hasBasis = true;

               primal = _simplifier->unsimplifiedPrimal();
               dual = _simplifier->unsimplifiedDual();
            }
            else
            {
               _solver.getPrimalSol(primal);
               _solver.getDualSol(dual);

               // unscale vectors
               if(_scaler != nullptr)
               {
                  _scaler->unscalePrimal(_solver, primal);
                  _scaler->unscaleDual(_solver, dual);
               }

               // get basis of transformed problem
               basisStatusRows.reSize(_solver.nRows());
               basisStatusCols.reSize(_solver.nCols());
               _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                basisStatusCols.size());
               _hasBasis = true;
            }

            if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                  || _oldBasisStatusCols.size() != basisStatusCols.size())
               _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);

            break;

         case SPxSolverBase<R>::ABORT_CYCLING:
            if(_simplifier == nullptr && boolParam(SoPlexBase<R>::ACCEPTCYCLING))
            {
               _solver.getPrimalSol(primal);
               _solver.getDualSol(dual);

               // unscale vectors
               if(_scaler != nullptr)
               {
                  _scaler->unscalePrimal(_solver, primal);
                  _scaler->unscaleDual(_solver, dual);
               }
            }

            break;

         // intentional fallthrough
         case SPxSolverBase<R>::ABORT_TIME:
         case SPxSolverBase<R>::ABORT_ITER:
         case SPxSolverBase<R>::ABORT_VALUE:
         case SPxSolverBase<R>::REGULAR:
         case SPxSolverBase<R>::RUNNING:
         case SPxSolverBase<R>::UNBOUNDED:
            _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

            if(_hasBasis && _simplifier == nullptr)
            {
               basisStatusRows.reSize(_solver.nRows());
               basisStatusCols.reSize(_solver.nCols());
               _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                                basisStatusCols.size());

               if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                     || _oldBasisStatusCols.size() != basisStatusCols.size())
                  _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);
            }
            else
            {
               _hasBasis = false;
               _rationalLUSolver.clear();
            }

            break;

         case SPxSolverBase<R>::INFEASIBLE:

            // if simplifier is active we can currently not return a Farkas ray or basis
            if(_simplifier != nullptr)
            {
               _hasBasis = false;
               _rationalLUSolver.clear();
               break;
            }

            // return Farkas ray as dual solution
            _solver.getDualfarkas(dual);

            // unscale vectors
            if(_scaler != nullptr)
               _scaler->unscaleDual(_solver, dual);

            // get basis of transformed problem
            basisStatusRows.reSize(_solver.nRows());
            basisStatusCols.reSize(_solver.nCols());
            _solver.getBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr(), basisStatusRows.size(),
                             basisStatusCols.size());
            _hasBasis = true;


            if(oldIterations < _statistics->iterations || _oldBasisStatusRows.size() != basisStatusRows.size()
                  || _oldBasisStatusCols.size() != basisStatusCols.size())
               _storeBasisAsOldBasis(basisStatusRows, basisStatusCols);

            break;

         case SPxSolverBase<R>::INForUNBD:
         case SPxSolverBase<R>::SINGULAR:
         default:
            _hasBasis = false;
            _rationalLUSolver.clear();
            break;
         }
      }
   }
   catch(...)
   {
      SPX_MSG_INFO1(spxout, spxout << "Exception thrown during floating-point solve.\n");
      result = SPxSolverBase<R>::ERROR;
      _hasBasis = false;
      _rationalLUSolver.clear();

   }

   // restore original LP if necessary
   if(_simplifier != nullptr || _scaler != nullptr)
   {
      assert(rationalLP != nullptr);
      _solver.loadLP((SPxLPBase<R>)(*rationalLP));
      rationalLP->~SPxLPRational();
      spx_free(rationalLP);

      if(_hasBasis)
         _solver.setBasis(basisStatusRows.get_ptr(), basisStatusCols.get_ptr());
   }

   return result;
}